

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void write_buffer_8x8(__m128i *in,uint16_t *output,int stride,int fliplr,int flipud,int shift,int bd
                     )

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  int *piVar3;
  uint16_t *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  __m128i *palVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  __m128i alVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ushort uVar22;
  uint16_t uVar24;
  ushort uVar25;
  uint16_t uVar26;
  ushort uVar27;
  uint16_t uVar28;
  ushort uVar29;
  uint16_t uVar30;
  ushort uVar31;
  uint16_t uVar32;
  ushort uVar33;
  uint16_t uVar34;
  ushort uVar35;
  uint16_t uVar36;
  ushort uVar37;
  uint16_t uVar39;
  ushort uVar40;
  uint16_t uVar41;
  ushort uVar44;
  uint16_t uVar45;
  ushort uVar46;
  uint16_t uVar47;
  ushort uVar48;
  uint16_t uVar49;
  ushort uVar50;
  uint16_t uVar51;
  ushort uVar52;
  uint16_t uVar53;
  ushort uVar54;
  uint16_t uVar55;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ushort uVar56;
  uint16_t uVar57;
  ushort uVar58;
  uint16_t uVar59;
  ushort uVar63;
  uint16_t uVar64;
  ushort uVar65;
  uint16_t uVar66;
  ushort uVar67;
  uint16_t uVar68;
  ushort uVar69;
  uint16_t uVar70;
  ushort uVar71;
  uint16_t uVar72;
  ushort uVar73;
  uint16_t uVar74;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  ushort uVar75;
  undefined1 auVar62 [16];
  uint16_t uVar76;
  undefined1 in_XMM4 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  short sVar84;
  short sVar86;
  short sVar87;
  short sVar88;
  ushort uVar89;
  short sVar90;
  ushort uVar91;
  short sVar92;
  ushort uVar93;
  short sVar94;
  ushort uVar95;
  __m128i in_XMM5;
  undefined1 auVar85 [16];
  short sVar96;
  ushort uVar97;
  uint16_t uVar98;
  ushort uVar101;
  uint16_t uVar102;
  ushort uVar103;
  uint16_t uVar104;
  ushort uVar105;
  uint16_t uVar106;
  ushort uVar107;
  uint16_t uVar108;
  ushort uVar109;
  uint16_t uVar110;
  ushort uVar111;
  uint16_t uVar112;
  undefined1 auVar99 [16];
  ushort uVar113;
  undefined1 auVar100 [16];
  uint16_t uVar114;
  uint16_t uVar115;
  uint16_t uVar118;
  uint16_t uVar119;
  uint16_t uVar120;
  uint16_t uVar121;
  uint16_t uVar122;
  uint16_t uVar123;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  uint16_t uVar124;
  ushort uVar125;
  uint16_t uVar126;
  ushort uVar128;
  uint16_t uVar129;
  ushort uVar130;
  uint16_t uVar131;
  ushort uVar132;
  uint16_t uVar133;
  ushort uVar134;
  uint16_t uVar135;
  ushort uVar136;
  uint16_t uVar137;
  ushort uVar138;
  uint16_t uVar139;
  undefined1 auVar127 [16];
  ushort uVar140;
  uint16_t uVar141;
  ushort uVar142;
  uint16_t uVar143;
  ushort uVar150;
  uint16_t uVar151;
  ushort uVar152;
  uint16_t uVar153;
  ushort uVar154;
  uint16_t uVar155;
  ushort uVar156;
  uint16_t uVar157;
  ushort uVar158;
  uint16_t uVar159;
  ushort uVar160;
  uint16_t uVar161;
  undefined1 in_XMM9 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  ushort uVar162;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  uint16_t uVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  int iVar166;
  int iVar168;
  int iVar169;
  int iVar170;
  undefined1 auVar167 [16];
  int iVar171;
  int iVar174;
  int iVar175;
  int iVar176;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  short sVar23;
  short sVar38;
  int iVar77;
  int iVar81;
  int iVar82;
  int iVar83;
  
  round_shift_8x8(in,shift);
  auVar145 = *(undefined1 (*) [16])output;
  auVar43 = *(undefined1 (*) [16])(output + stride);
  auVar61 = *(undefined1 (*) [16])(output + stride * 2);
  auVar85 = *(undefined1 (*) [16])(output + stride * 3);
  pauVar1 = (undefined1 (*) [16])(output + stride * 4);
  uVar9 = *(undefined8 *)(*pauVar1 + 8);
  pauVar2 = (undefined1 (*) [16])(output + stride * 5);
  uVar10 = *(undefined8 *)(*pauVar2 + 8);
  auVar21 = *(undefined1 (*) [16])(output + stride * 6);
  uVar11 = *(undefined8 *)(*(undefined1 (*) [16])(output + stride * 7) + 8);
  uVar29 = (ushort)((ulong)uVar9 >> 0x10);
  uVar31 = (ushort)((ulong)uVar9 >> 0x20);
  uVar33 = (ushort)((ulong)uVar9 >> 0x30);
  uVar22 = (ushort)((ulong)uVar10 >> 0x10);
  uVar25 = (ushort)((ulong)uVar10 >> 0x20);
  uVar27 = (ushort)((ulong)uVar10 >> 0x30);
  uVar89 = auVar21._8_2_;
  uVar91 = auVar21._10_2_;
  uVar93 = auVar21._12_2_;
  uVar95 = auVar21._14_2_;
  if (flipud == 0) {
    auVar15 = pmovzxwd(auVar21,auVar145);
    iVar5 = (int)(*in)[0];
    iVar6 = *(int *)((long)*in + 4);
    iVar7 = (int)(*in)[1];
    iVar8 = *(int *)((long)*in + 0xc);
    iVar166 = (int)in[1][0];
    iVar168 = *(int *)((long)in[1] + 4);
    iVar169 = (int)in[1][1];
    iVar170 = *(int *)((long)in[1] + 0xc);
    bVar14 = fliplr == 0;
    if (bVar14) {
      auVar144._0_4_ = iVar5 + auVar15._0_4_;
      auVar144._4_4_ = iVar6 + auVar15._4_4_;
      auVar144._8_4_ = iVar7 + auVar15._8_4_;
      auVar144._12_4_ = iVar8 + auVar15._12_4_;
    }
    else {
      auVar144._0_4_ = iVar170 + auVar15._0_4_;
      auVar144._4_4_ = iVar169 + auVar15._4_4_;
      auVar144._8_4_ = iVar168 + auVar15._8_4_;
      auVar144._12_4_ = iVar166 + auVar15._12_4_;
      iVar166 = iVar8;
      iVar168 = iVar7;
      iVar169 = iVar6;
      iVar170 = iVar5;
    }
    iVar5 = (int)in[2][0];
    iVar6 = *(int *)((long)in[2] + 4);
    iVar7 = (int)in[2][1];
    iVar8 = *(int *)((long)in[2] + 0xc);
    iVar171 = (int)in[3][0];
    iVar174 = *(int *)((long)in[3] + 4);
    iVar175 = (int)in[3][1];
    iVar176 = *(int *)((long)in[3] + 0xc);
    auVar15 = pmovzxwd(auVar15,auVar43);
    if (bVar14) {
      auVar147._0_4_ = iVar5 + auVar15._0_4_;
      auVar147._4_4_ = iVar6 + auVar15._4_4_;
      auVar147._8_4_ = iVar7 + auVar15._8_4_;
      auVar147._12_4_ = iVar8 + auVar15._12_4_;
    }
    else {
      auVar147._0_4_ = iVar176 + auVar15._0_4_;
      auVar147._4_4_ = iVar175 + auVar15._4_4_;
      auVar147._8_4_ = iVar174 + auVar15._8_4_;
      auVar147._12_4_ = iVar171 + auVar15._12_4_;
      iVar171 = iVar8;
      iVar174 = iVar7;
      iVar175 = iVar6;
      iVar176 = iVar5;
    }
    auVar15 = pmovzxwd(in_XMM4,auVar61);
    iVar5 = (int)in[4][0];
    iVar6 = *(int *)((long)in[4] + 4);
    iVar7 = (int)in[4][1];
    iVar8 = *(int *)((long)in[4] + 0xc);
    alVar19 = in[5];
    if (bVar14) {
      auVar62._0_4_ = iVar5 + auVar15._0_4_;
      auVar62._4_4_ = iVar6 + auVar15._4_4_;
      auVar62._8_4_ = iVar7 + auVar15._8_4_;
      auVar62._12_4_ = iVar8 + auVar15._12_4_;
    }
    else {
      in_XMM5[0]._4_4_ = iVar7;
      in_XMM5[0]._0_4_ = iVar8;
      in_XMM5[1]._0_4_ = iVar6;
      in_XMM5[1]._4_4_ = iVar5;
      auVar62._0_4_ = alVar19[1]._4_4_ + auVar15._0_4_;
      auVar62._4_4_ = (int)alVar19[1] + auVar15._4_4_;
      auVar62._8_4_ = alVar19[0]._4_4_ + auVar15._8_4_;
      auVar62._12_4_ = (int)alVar19[0] + auVar15._12_4_;
      alVar19 = in_XMM5;
    }
    auVar15 = pmovsxbw((undefined1  [16])in_XMM5,0x101010101010101);
    auVar148 = pmovzxwd(in_XMM9,auVar85);
    iVar5 = (int)in[6][0];
    iVar6 = *(int *)((long)in[6] + 4);
    iVar7 = (int)in[6][1];
    iVar8 = *(int *)((long)in[6] + 0xc);
    iVar77 = (int)in[7][0];
    iVar81 = *(int *)((long)in[7] + 4);
    iVar82 = (int)in[7][1];
    iVar83 = *(int *)((long)in[7] + 0xc);
    if (bVar14) {
      auVar100._0_4_ = iVar5 + auVar148._0_4_;
      auVar100._4_4_ = iVar6 + auVar148._4_4_;
      auVar100._8_4_ = iVar7 + auVar148._8_4_;
      auVar100._12_4_ = iVar8 + auVar148._12_4_;
    }
    else {
      auVar100._0_4_ = iVar83 + auVar148._0_4_;
      auVar100._4_4_ = iVar82 + auVar148._4_4_;
      auVar100._8_4_ = iVar81 + auVar148._8_4_;
      auVar100._12_4_ = iVar77 + auVar148._12_4_;
      iVar77 = iVar8;
      iVar81 = iVar7;
      iVar82 = iVar6;
      iVar83 = iVar5;
    }
    auVar79._0_4_ = iVar77 + (uint)auVar85._8_2_;
    auVar79._4_4_ = iVar81 + (uint)auVar85._10_2_;
    auVar79._8_4_ = iVar82 + (uint)auVar85._12_2_;
    auVar79._12_4_ = iVar83 + (uint)auVar85._14_2_;
    auVar85 = psllw(auVar15,ZEXT416((uint)bd));
    auVar15._0_4_ = iVar166 + (uint)auVar145._8_2_;
    auVar15._4_4_ = iVar168 + (uint)auVar145._10_2_;
    auVar15._8_4_ = iVar169 + (uint)auVar145._12_2_;
    auVar15._12_4_ = iVar170 + (uint)auVar145._14_2_;
    auVar173._0_4_ = iVar171 + (uint)auVar43._8_2_;
    auVar173._4_4_ = iVar174 + (uint)auVar43._10_2_;
    auVar173._8_4_ = iVar175 + (uint)auVar43._12_2_;
    auVar173._12_4_ = iVar176 + (uint)auVar43._14_2_;
    auVar145._0_4_ = (int)alVar19[0] + (uint)auVar61._8_2_;
    auVar145._4_4_ = alVar19[0]._4_4_ + (uint)auVar61._10_2_;
    auVar145._8_4_ = (int)alVar19[1] + (uint)auVar61._12_2_;
    auVar145._12_4_ = alVar19[1]._4_4_ + (uint)auVar61._14_2_;
    auVar43 = pmovzxwd(auVar148,*pauVar1);
    iVar5 = (int)in[8][0];
    iVar6 = *(int *)((long)in[8] + 4);
    iVar7 = (int)in[8][1];
    iVar8 = *(int *)((long)in[8] + 0xc);
    iVar166 = (int)in[9][0];
    iVar168 = *(int *)((long)in[9] + 4);
    iVar169 = (int)in[9][1];
    iVar170 = *(int *)((long)in[9] + 0xc);
    if (bVar14) {
      auVar61._0_4_ = iVar5 + auVar43._0_4_;
      auVar61._4_4_ = iVar6 + auVar43._4_4_;
      auVar61._8_4_ = iVar7 + auVar43._8_4_;
      auVar61._12_4_ = iVar8 + auVar43._12_4_;
    }
    else {
      auVar61._0_4_ = iVar170 + auVar43._0_4_;
      auVar61._4_4_ = iVar169 + auVar43._4_4_;
      auVar61._8_4_ = iVar168 + auVar43._8_4_;
      auVar61._12_4_ = iVar166 + auVar43._12_4_;
      iVar166 = iVar8;
      iVar168 = iVar7;
      iVar169 = iVar6;
      iVar170 = iVar5;
    }
    auVar43._0_4_ = iVar166 + (uint)(ushort)uVar9;
    auVar43._4_4_ = iVar168 + (uint)uVar29;
    auVar43._8_4_ = iVar169 + (uint)uVar31;
    auVar43._12_4_ = iVar170 + (uint)uVar33;
    auVar148 = packusdw(auVar61,auVar43);
    auVar43 = packusdw(auVar144,auVar15);
    sVar84 = auVar85._0_2_ + -1;
    sVar86 = auVar85._2_2_ + -1;
    sVar87 = auVar85._4_2_ + -1;
    sVar88 = auVar85._6_2_ + -1;
    sVar90 = auVar85._8_2_ + -1;
    sVar92 = auVar85._10_2_ + -1;
    sVar94 = auVar85._12_2_ + -1;
    sVar96 = auVar85._14_2_ + -1;
    auVar61 = packusdw(auVar147,auVar173);
    auVar145 = packusdw(auVar62,auVar145);
    auVar15 = packusdw(auVar100,auVar79);
    auVar85 = pmovzxwd(auVar79,*pauVar2);
    iVar5 = (int)in[10][0];
    iVar6 = *(int *)((long)in[10] + 4);
    iVar7 = (int)in[10][1];
    iVar8 = *(int *)((long)in[10] + 0xc);
    iVar166 = (int)in[0xb][0];
    iVar168 = *(int *)((long)in[0xb] + 4);
    iVar169 = (int)in[0xb][1];
    iVar170 = *(int *)((long)in[0xb] + 0xc);
    if (bVar14) {
      auVar149._0_4_ = iVar5 + auVar85._0_4_;
      auVar149._4_4_ = iVar6 + auVar85._4_4_;
      auVar149._8_4_ = iVar7 + auVar85._8_4_;
      auVar149._12_4_ = iVar8 + auVar85._12_4_;
    }
    else {
      auVar149._0_4_ = iVar170 + auVar85._0_4_;
      auVar149._4_4_ = iVar169 + auVar85._4_4_;
      auVar149._8_4_ = iVar168 + auVar85._8_4_;
      auVar149._12_4_ = iVar166 + auVar85._12_4_;
      iVar166 = iVar8;
      iVar168 = iVar7;
      iVar169 = iVar6;
      iVar170 = iVar5;
    }
    auVar20._0_4_ = iVar166 + (uint)(ushort)uVar10;
    auVar20._4_4_ = iVar168 + (uint)uVar22;
    auVar20._8_4_ = iVar169 + (uint)uVar25;
    auVar20._12_4_ = iVar170 + (uint)uVar27;
    auVar144 = packusdw(auVar149,auVar20);
    sVar23 = auVar43._0_2_;
    uVar22 = (ushort)(sVar84 < sVar23) * sVar84 | (ushort)(sVar84 >= sVar23) * sVar23;
    sVar23 = auVar43._2_2_;
    uVar25 = (ushort)(sVar86 < sVar23) * sVar86 | (ushort)(sVar86 >= sVar23) * sVar23;
    sVar23 = auVar43._4_2_;
    uVar27 = (ushort)(sVar87 < sVar23) * sVar87 | (ushort)(sVar87 >= sVar23) * sVar23;
    sVar23 = auVar43._6_2_;
    uVar29 = (ushort)(sVar88 < sVar23) * sVar88 | (ushort)(sVar88 >= sVar23) * sVar23;
    sVar23 = auVar43._8_2_;
    uVar31 = (ushort)(sVar90 < sVar23) * sVar90 | (ushort)(sVar90 >= sVar23) * sVar23;
    sVar23 = auVar43._10_2_;
    uVar33 = (ushort)(sVar92 < sVar23) * sVar92 | (ushort)(sVar92 >= sVar23) * sVar23;
    sVar23 = auVar43._12_2_;
    sVar38 = auVar43._14_2_;
    uVar35 = (ushort)(sVar94 < sVar23) * sVar94 | (ushort)(sVar94 >= sVar23) * sVar23;
    uVar37 = (ushort)(sVar96 < sVar38) * sVar96 | (ushort)(sVar96 >= sVar38) * sVar38;
    sVar23 = auVar61._0_2_;
    uVar40 = (ushort)(sVar84 < sVar23) * sVar84 | (ushort)(sVar84 >= sVar23) * sVar23;
    sVar23 = auVar61._2_2_;
    uVar44 = (ushort)(sVar86 < sVar23) * sVar86 | (ushort)(sVar86 >= sVar23) * sVar23;
    sVar23 = auVar61._4_2_;
    uVar46 = (ushort)(sVar87 < sVar23) * sVar87 | (ushort)(sVar87 >= sVar23) * sVar23;
    sVar23 = auVar61._6_2_;
    uVar48 = (ushort)(sVar88 < sVar23) * sVar88 | (ushort)(sVar88 >= sVar23) * sVar23;
    sVar23 = auVar61._8_2_;
    uVar50 = (ushort)(sVar90 < sVar23) * sVar90 | (ushort)(sVar90 >= sVar23) * sVar23;
    sVar23 = auVar61._10_2_;
    uVar52 = (ushort)(sVar92 < sVar23) * sVar92 | (ushort)(sVar92 >= sVar23) * sVar23;
    sVar23 = auVar61._12_2_;
    sVar38 = auVar61._14_2_;
    uVar54 = (ushort)(sVar94 < sVar23) * sVar94 | (ushort)(sVar94 >= sVar23) * sVar23;
    uVar56 = (ushort)(sVar96 < sVar38) * sVar96 | (ushort)(sVar96 >= sVar38) * sVar38;
    sVar23 = auVar145._0_2_;
    uVar58 = (ushort)(sVar84 < sVar23) * sVar84 | (ushort)(sVar84 >= sVar23) * sVar23;
    sVar23 = auVar145._2_2_;
    uVar63 = (ushort)(sVar86 < sVar23) * sVar86 | (ushort)(sVar86 >= sVar23) * sVar23;
    sVar23 = auVar145._4_2_;
    uVar65 = (ushort)(sVar87 < sVar23) * sVar87 | (ushort)(sVar87 >= sVar23) * sVar23;
    sVar23 = auVar145._6_2_;
    uVar67 = (ushort)(sVar88 < sVar23) * sVar88 | (ushort)(sVar88 >= sVar23) * sVar23;
    sVar23 = auVar145._8_2_;
    uVar69 = (ushort)(sVar90 < sVar23) * sVar90 | (ushort)(sVar90 >= sVar23) * sVar23;
    sVar23 = auVar145._10_2_;
    uVar71 = (ushort)(sVar92 < sVar23) * sVar92 | (ushort)(sVar92 >= sVar23) * sVar23;
    sVar23 = auVar145._12_2_;
    sVar38 = auVar145._14_2_;
    uVar73 = (ushort)(sVar94 < sVar23) * sVar94 | (ushort)(sVar94 >= sVar23) * sVar23;
    uVar75 = (ushort)(sVar96 < sVar38) * sVar96 | (ushort)(sVar96 >= sVar38) * sVar38;
    sVar23 = auVar15._0_2_;
    uVar97 = (ushort)(sVar84 < sVar23) * sVar84 | (ushort)(sVar84 >= sVar23) * sVar23;
    sVar23 = auVar15._2_2_;
    uVar101 = (ushort)(sVar86 < sVar23) * sVar86 | (ushort)(sVar86 >= sVar23) * sVar23;
    sVar23 = auVar15._4_2_;
    uVar103 = (ushort)(sVar87 < sVar23) * sVar87 | (ushort)(sVar87 >= sVar23) * sVar23;
    sVar23 = auVar15._6_2_;
    uVar105 = (ushort)(sVar88 < sVar23) * sVar88 | (ushort)(sVar88 >= sVar23) * sVar23;
    sVar23 = auVar15._8_2_;
    uVar107 = (ushort)(sVar90 < sVar23) * sVar90 | (ushort)(sVar90 >= sVar23) * sVar23;
    sVar23 = auVar15._10_2_;
    uVar109 = (ushort)(sVar92 < sVar23) * sVar92 | (ushort)(sVar92 >= sVar23) * sVar23;
    sVar23 = auVar15._12_2_;
    sVar38 = auVar15._14_2_;
    uVar111 = (ushort)(sVar94 < sVar23) * sVar94 | (ushort)(sVar94 >= sVar23) * sVar23;
    uVar113 = (ushort)(sVar96 < sVar38) * sVar96 | (ushort)(sVar96 >= sVar38) * sVar38;
    sVar23 = auVar148._0_2_;
    uVar125 = (ushort)(sVar84 < sVar23) * sVar84 | (ushort)(sVar84 >= sVar23) * sVar23;
    sVar23 = auVar148._2_2_;
    uVar128 = (ushort)(sVar86 < sVar23) * sVar86 | (ushort)(sVar86 >= sVar23) * sVar23;
    sVar23 = auVar148._4_2_;
    uVar130 = (ushort)(sVar87 < sVar23) * sVar87 | (ushort)(sVar87 >= sVar23) * sVar23;
    sVar23 = auVar148._6_2_;
    uVar132 = (ushort)(sVar88 < sVar23) * sVar88 | (ushort)(sVar88 >= sVar23) * sVar23;
    sVar23 = auVar148._8_2_;
    uVar134 = (ushort)(sVar90 < sVar23) * sVar90 | (ushort)(sVar90 >= sVar23) * sVar23;
    sVar23 = auVar148._10_2_;
    uVar136 = (ushort)(sVar92 < sVar23) * sVar92 | (ushort)(sVar92 >= sVar23) * sVar23;
    sVar23 = auVar148._12_2_;
    sVar38 = auVar148._14_2_;
    uVar138 = (ushort)(sVar94 < sVar23) * sVar94 | (ushort)(sVar94 >= sVar23) * sVar23;
    uVar140 = (ushort)(sVar96 < sVar38) * sVar96 | (ushort)(sVar96 >= sVar38) * sVar38;
    sVar23 = auVar144._0_2_;
    uVar142 = (ushort)(sVar84 < sVar23) * sVar84 | (ushort)(sVar84 >= sVar23) * sVar23;
    sVar23 = auVar144._2_2_;
    uVar150 = (ushort)(sVar86 < sVar23) * sVar86 | (ushort)(sVar86 >= sVar23) * sVar23;
    sVar23 = auVar144._4_2_;
    uVar152 = (ushort)(sVar87 < sVar23) * sVar87 | (ushort)(sVar87 >= sVar23) * sVar23;
    sVar23 = auVar144._6_2_;
    uVar154 = (ushort)(sVar88 < sVar23) * sVar88 | (ushort)(sVar88 >= sVar23) * sVar23;
    sVar23 = auVar144._8_2_;
    uVar156 = (ushort)(sVar90 < sVar23) * sVar90 | (ushort)(sVar90 >= sVar23) * sVar23;
    sVar23 = auVar144._10_2_;
    uVar158 = (ushort)(sVar92 < sVar23) * sVar92 | (ushort)(sVar92 >= sVar23) * sVar23;
    sVar23 = auVar144._12_2_;
    sVar38 = auVar144._14_2_;
    uVar160 = (ushort)(sVar94 < sVar23) * sVar94 | (ushort)(sVar94 >= sVar23) * sVar23;
    uVar162 = (ushort)(sVar96 < sVar38) * sVar96 | (ushort)(sVar96 >= sVar38) * sVar38;
    auVar145 = pmovzxwd(auVar85,auVar21);
    iVar5 = (int)in[0xc][0];
    iVar6 = *(int *)((long)in[0xc] + 4);
    iVar7 = (int)in[0xc][1];
    iVar8 = *(int *)((long)in[0xc] + 0xc);
    iVar166 = (int)in[0xd][0];
    iVar168 = *(int *)((long)in[0xd] + 4);
    iVar169 = (int)in[0xd][1];
    iVar170 = *(int *)((long)in[0xd] + 0xc);
    if (bVar14) {
      auVar85._0_4_ = iVar5 + auVar145._0_4_;
      auVar85._4_4_ = iVar6 + auVar145._4_4_;
      auVar85._8_4_ = iVar7 + auVar145._8_4_;
      auVar85._12_4_ = iVar8 + auVar145._12_4_;
    }
    else {
      auVar85._0_4_ = iVar170 + auVar145._0_4_;
      auVar85._4_4_ = iVar169 + auVar145._4_4_;
      auVar85._8_4_ = iVar168 + auVar145._8_4_;
      auVar85._12_4_ = iVar166 + auVar145._12_4_;
      iVar166 = iVar8;
      iVar168 = iVar7;
      iVar169 = iVar6;
      iVar170 = iVar5;
    }
    auVar21._0_4_ = iVar166 + (uint)uVar89;
    auVar21._4_4_ = iVar168 + (uint)uVar91;
    auVar21._8_4_ = iVar169 + (uint)uVar93;
    auVar21._12_4_ = iVar170 + (uint)uVar95;
    auVar145 = packusdw(auVar85,auVar21);
    uVar24 = (-1 < (short)uVar22) * uVar22;
    uVar26 = (-1 < (short)uVar25) * uVar25;
    uVar28 = (-1 < (short)uVar27) * uVar27;
    uVar30 = (-1 < (short)uVar29) * uVar29;
    uVar32 = (-1 < (short)uVar31) * uVar31;
    uVar34 = (-1 < (short)uVar33) * uVar33;
    uVar36 = (-1 < (short)uVar35) * uVar35;
    uVar39 = (-1 < (short)uVar37) * uVar37;
    uVar41 = (-1 < (short)uVar40) * uVar40;
    uVar45 = (-1 < (short)uVar44) * uVar44;
    uVar47 = (-1 < (short)uVar46) * uVar46;
    uVar49 = (-1 < (short)uVar48) * uVar48;
    uVar51 = (-1 < (short)uVar50) * uVar50;
    uVar53 = (-1 < (short)uVar52) * uVar52;
    uVar55 = (-1 < (short)uVar54) * uVar54;
    uVar57 = (-1 < (short)uVar56) * uVar56;
    uVar59 = (-1 < (short)uVar58) * uVar58;
    uVar64 = (-1 < (short)uVar63) * uVar63;
    uVar66 = (-1 < (short)uVar65) * uVar65;
    uVar68 = (-1 < (short)uVar67) * uVar67;
    uVar70 = (-1 < (short)uVar69) * uVar69;
    uVar72 = (-1 < (short)uVar71) * uVar71;
    uVar74 = (-1 < (short)uVar73) * uVar73;
    uVar76 = (-1 < (short)uVar75) * uVar75;
    uVar98 = (-1 < (short)uVar97) * uVar97;
    uVar102 = (-1 < (short)uVar101) * uVar101;
    uVar104 = (-1 < (short)uVar103) * uVar103;
    uVar106 = (-1 < (short)uVar105) * uVar105;
    uVar108 = (-1 < (short)uVar107) * uVar107;
    uVar110 = (-1 < (short)uVar109) * uVar109;
    uVar112 = (-1 < (short)uVar111) * uVar111;
    uVar114 = (-1 < (short)uVar113) * uVar113;
    uVar126 = (-1 < (short)uVar125) * uVar125;
    uVar129 = (-1 < (short)uVar128) * uVar128;
    uVar131 = (-1 < (short)uVar130) * uVar130;
    uVar133 = (-1 < (short)uVar132) * uVar132;
    uVar135 = (-1 < (short)uVar134) * uVar134;
    uVar137 = (-1 < (short)uVar136) * uVar136;
    uVar139 = (-1 < (short)uVar138) * uVar138;
    uVar141 = (-1 < (short)uVar140) * uVar140;
    uVar143 = (-1 < (short)uVar142) * uVar142;
    uVar151 = (-1 < (short)uVar150) * uVar150;
    uVar153 = (-1 < (short)uVar152) * uVar152;
    uVar155 = (-1 < (short)uVar154) * uVar154;
    uVar157 = (-1 < (short)uVar156) * uVar156;
    uVar159 = (-1 < (short)uVar158) * uVar158;
    uVar161 = (-1 < (short)uVar160) * uVar160;
    uVar163 = (-1 < (short)uVar162) * uVar162;
    sVar23 = auVar145._0_2_;
    uVar22 = (ushort)(sVar84 < sVar23) * sVar84 | (ushort)(sVar84 >= sVar23) * sVar23;
    sVar23 = auVar145._2_2_;
    uVar25 = (ushort)(sVar86 < sVar23) * sVar86 | (ushort)(sVar86 >= sVar23) * sVar23;
    sVar23 = auVar145._4_2_;
    uVar27 = (ushort)(sVar87 < sVar23) * sVar87 | (ushort)(sVar87 >= sVar23) * sVar23;
    sVar23 = auVar145._6_2_;
    uVar29 = (ushort)(sVar88 < sVar23) * sVar88 | (ushort)(sVar88 >= sVar23) * sVar23;
    sVar23 = auVar145._8_2_;
    uVar31 = (ushort)(sVar90 < sVar23) * sVar90 | (ushort)(sVar90 >= sVar23) * sVar23;
    sVar23 = auVar145._10_2_;
    uVar33 = (ushort)(sVar92 < sVar23) * sVar92 | (ushort)(sVar92 >= sVar23) * sVar23;
    sVar23 = auVar145._12_2_;
    sVar38 = auVar145._14_2_;
    uVar35 = (ushort)(sVar94 < sVar23) * sVar94 | (ushort)(sVar94 >= sVar23) * sVar23;
    uVar37 = (ushort)(sVar96 < sVar38) * sVar96 | (ushort)(sVar96 >= sVar38) * sVar38;
    uVar115 = (-1 < (short)uVar22) * uVar22;
    uVar118 = (-1 < (short)uVar25) * uVar25;
    uVar119 = (-1 < (short)uVar27) * uVar27;
    uVar120 = (-1 < (short)uVar29) * uVar29;
    uVar121 = (-1 < (short)uVar31) * uVar31;
    uVar122 = (-1 < (short)uVar33) * uVar33;
    uVar123 = (-1 < (short)uVar35) * uVar35;
    uVar124 = (-1 < (short)uVar37) * uVar37;
    palVar13 = in + 0xe;
    lVar12 = 0xf0;
  }
  else {
    iVar5 = (int)in[0xe][0];
    iVar6 = *(int *)((long)in[0xe] + 4);
    iVar7 = (int)in[0xe][1];
    iVar8 = *(int *)((long)in[0xe] + 0xc);
    auVar15 = pmovzxwd(auVar21,auVar145);
    iVar166 = (int)in[0xf][0];
    iVar168 = *(int *)((long)in[0xf] + 4);
    iVar169 = (int)in[0xf][1];
    iVar170 = *(int *)((long)in[0xf] + 0xc);
    bVar14 = fliplr == 0;
    if (bVar14) {
      auVar148._0_4_ = iVar5 + auVar15._0_4_;
      auVar148._4_4_ = iVar6 + auVar15._4_4_;
      auVar148._8_4_ = iVar7 + auVar15._8_4_;
      auVar148._12_4_ = iVar8 + auVar15._12_4_;
    }
    else {
      auVar148._0_4_ = iVar170 + auVar15._0_4_;
      auVar148._4_4_ = iVar169 + auVar15._4_4_;
      auVar148._8_4_ = iVar168 + auVar15._8_4_;
      auVar148._12_4_ = iVar166 + auVar15._12_4_;
      iVar166 = iVar8;
      iVar168 = iVar7;
      iVar169 = iVar6;
      iVar170 = iVar5;
    }
    auVar15 = pmovzxwd(auVar15,auVar43);
    iVar5 = (int)in[0xc][0];
    iVar6 = *(int *)((long)in[0xc] + 4);
    iVar7 = (int)in[0xc][1];
    iVar8 = *(int *)((long)in[0xc] + 0xc);
    iVar171 = (int)in[0xd][0];
    iVar174 = *(int *)((long)in[0xd] + 4);
    iVar175 = (int)in[0xd][1];
    iVar176 = *(int *)((long)in[0xd] + 0xc);
    if (bVar14) {
      auVar42._0_4_ = iVar5 + auVar15._0_4_;
      auVar42._4_4_ = iVar6 + auVar15._4_4_;
      auVar42._8_4_ = iVar7 + auVar15._8_4_;
      auVar42._12_4_ = iVar8 + auVar15._12_4_;
    }
    else {
      auVar42._0_4_ = iVar176 + auVar15._0_4_;
      auVar42._4_4_ = iVar175 + auVar15._4_4_;
      auVar42._8_4_ = iVar174 + auVar15._8_4_;
      auVar42._12_4_ = iVar171 + auVar15._12_4_;
      iVar171 = iVar8;
      iVar174 = iVar7;
      iVar175 = iVar6;
      iVar176 = iVar5;
    }
    auVar15 = pmovzxwd(in_XMM4,auVar61);
    iVar5 = (int)in[10][0];
    iVar6 = *(int *)((long)in[10] + 4);
    iVar7 = (int)in[10][1];
    iVar8 = *(int *)((long)in[10] + 0xc);
    alVar19 = in[0xb];
    if (bVar14) {
      auVar60._0_4_ = iVar5 + auVar15._0_4_;
      auVar60._4_4_ = iVar6 + auVar15._4_4_;
      auVar60._8_4_ = iVar7 + auVar15._8_4_;
      auVar60._12_4_ = iVar8 + auVar15._12_4_;
    }
    else {
      in_XMM5[0]._4_4_ = iVar7;
      in_XMM5[0]._0_4_ = iVar8;
      in_XMM5[1]._0_4_ = iVar6;
      in_XMM5[1]._4_4_ = iVar5;
      auVar60._0_4_ = alVar19[1]._4_4_ + auVar15._0_4_;
      auVar60._4_4_ = (int)alVar19[1] + auVar15._4_4_;
      auVar60._8_4_ = alVar19[0]._4_4_ + auVar15._8_4_;
      auVar60._12_4_ = (int)alVar19[0] + auVar15._12_4_;
      alVar19 = in_XMM5;
    }
    auVar15 = pmovsxbw((undefined1  [16])in_XMM5,0x101010101010101);
    auVar144 = pmovzxwd(in_XMM9,auVar85);
    iVar5 = (int)in[8][0];
    iVar6 = *(int *)((long)in[8] + 4);
    iVar7 = (int)in[8][1];
    iVar8 = *(int *)((long)in[8] + 0xc);
    iVar77 = (int)in[9][0];
    iVar81 = *(int *)((long)in[9] + 4);
    iVar82 = (int)in[9][1];
    iVar83 = *(int *)((long)in[9] + 0xc);
    if (bVar14) {
      auVar99._0_4_ = iVar5 + auVar144._0_4_;
      auVar99._4_4_ = iVar6 + auVar144._4_4_;
      auVar99._8_4_ = iVar7 + auVar144._8_4_;
      auVar99._12_4_ = iVar8 + auVar144._12_4_;
    }
    else {
      auVar99._0_4_ = iVar83 + auVar144._0_4_;
      auVar99._4_4_ = iVar82 + auVar144._4_4_;
      auVar99._8_4_ = iVar81 + auVar144._8_4_;
      auVar99._12_4_ = iVar77 + auVar144._12_4_;
      iVar77 = iVar8;
      iVar81 = iVar7;
      iVar82 = iVar6;
      iVar83 = iVar5;
    }
    auVar78._0_4_ = iVar77 + (uint)auVar85._8_2_;
    auVar78._4_4_ = iVar81 + (uint)auVar85._10_2_;
    auVar78._8_4_ = iVar82 + (uint)auVar85._12_2_;
    auVar78._12_4_ = iVar83 + (uint)auVar85._14_2_;
    auVar85 = psllw(auVar15,ZEXT416((uint)bd));
    auVar167._0_4_ = iVar166 + (uint)auVar145._8_2_;
    auVar167._4_4_ = iVar168 + (uint)auVar145._10_2_;
    auVar167._8_4_ = iVar169 + (uint)auVar145._12_2_;
    auVar167._12_4_ = iVar170 + (uint)auVar145._14_2_;
    auVar172._0_4_ = iVar171 + (uint)auVar43._8_2_;
    auVar172._4_4_ = iVar174 + (uint)auVar43._10_2_;
    auVar172._8_4_ = iVar175 + (uint)auVar43._12_2_;
    auVar172._12_4_ = iVar176 + (uint)auVar43._14_2_;
    auVar16._0_4_ = (int)alVar19[0] + (uint)auVar61._8_2_;
    auVar16._4_4_ = alVar19[0]._4_4_ + (uint)auVar61._10_2_;
    auVar16._8_4_ = (int)alVar19[1] + (uint)auVar61._12_2_;
    auVar16._12_4_ = alVar19[1]._4_4_ + (uint)auVar61._14_2_;
    auVar145 = pmovzxwd(auVar144,*pauVar1);
    iVar5 = (int)in[6][0];
    iVar6 = *(int *)((long)in[6] + 4);
    iVar7 = (int)in[6][1];
    iVar8 = *(int *)((long)in[6] + 0xc);
    iVar166 = (int)in[7][0];
    iVar168 = *(int *)((long)in[7] + 4);
    iVar169 = (int)in[7][1];
    iVar170 = *(int *)((long)in[7] + 0xc);
    if (bVar14) {
      auVar127._0_4_ = iVar5 + auVar145._0_4_;
      auVar127._4_4_ = iVar6 + auVar145._4_4_;
      auVar127._8_4_ = iVar7 + auVar145._8_4_;
      auVar127._12_4_ = iVar8 + auVar145._12_4_;
    }
    else {
      auVar127._0_4_ = iVar170 + auVar145._0_4_;
      auVar127._4_4_ = iVar169 + auVar145._4_4_;
      auVar127._8_4_ = iVar168 + auVar145._8_4_;
      auVar127._12_4_ = iVar166 + auVar145._12_4_;
      iVar166 = iVar8;
      iVar168 = iVar7;
      iVar169 = iVar6;
      iVar170 = iVar5;
    }
    auVar116._0_4_ = iVar166 + (uint)(ushort)uVar9;
    auVar116._4_4_ = iVar168 + (uint)uVar29;
    auVar116._8_4_ = iVar169 + (uint)uVar31;
    auVar116._12_4_ = iVar170 + (uint)uVar33;
    auVar144 = packusdw(auVar127,auVar116);
    auVar145 = packusdw(auVar148,auVar167);
    sVar84 = auVar85._0_2_ + -1;
    sVar86 = auVar85._2_2_ + -1;
    sVar87 = auVar85._4_2_ + -1;
    sVar88 = auVar85._6_2_ + -1;
    sVar90 = auVar85._8_2_ + -1;
    sVar92 = auVar85._10_2_ + -1;
    sVar94 = auVar85._12_2_ + -1;
    sVar96 = auVar85._14_2_ + -1;
    auVar43 = packusdw(auVar42,auVar172);
    auVar61 = packusdw(auVar60,auVar16);
    auVar15 = packusdw(auVar99,auVar78);
    auVar85 = pmovzxwd(auVar78,*pauVar2);
    iVar5 = (int)in[4][0];
    iVar6 = *(int *)((long)in[4] + 4);
    iVar7 = (int)in[4][1];
    iVar8 = *(int *)((long)in[4] + 0xc);
    iVar166 = (int)in[5][0];
    iVar168 = *(int *)((long)in[5] + 4);
    iVar169 = (int)in[5][1];
    iVar170 = *(int *)((long)in[5] + 0xc);
    if (bVar14) {
      auVar146._0_4_ = iVar5 + auVar85._0_4_;
      auVar146._4_4_ = iVar6 + auVar85._4_4_;
      auVar146._8_4_ = iVar7 + auVar85._8_4_;
      auVar146._12_4_ = iVar8 + auVar85._12_4_;
    }
    else {
      auVar146._0_4_ = iVar170 + auVar85._0_4_;
      auVar146._4_4_ = iVar169 + auVar85._4_4_;
      auVar146._8_4_ = iVar168 + auVar85._8_4_;
      auVar146._12_4_ = iVar166 + auVar85._12_4_;
      iVar166 = iVar8;
      iVar168 = iVar7;
      iVar169 = iVar6;
      iVar170 = iVar5;
    }
    auVar17._0_4_ = iVar166 + (uint)(ushort)uVar10;
    auVar17._4_4_ = iVar168 + (uint)uVar22;
    auVar17._8_4_ = iVar169 + (uint)uVar25;
    auVar17._12_4_ = iVar170 + (uint)uVar27;
    auVar147 = packusdw(auVar146,auVar17);
    iVar5 = (int)in[2][0];
    iVar6 = *(int *)((long)in[2] + 4);
    iVar7 = (int)in[2][1];
    iVar8 = *(int *)((long)in[2] + 0xc);
    sVar23 = auVar145._0_2_;
    uVar22 = (ushort)(sVar84 < sVar23) * sVar84 | (ushort)(sVar84 >= sVar23) * sVar23;
    sVar23 = auVar145._2_2_;
    uVar25 = (ushort)(sVar86 < sVar23) * sVar86 | (ushort)(sVar86 >= sVar23) * sVar23;
    sVar23 = auVar145._4_2_;
    uVar27 = (ushort)(sVar87 < sVar23) * sVar87 | (ushort)(sVar87 >= sVar23) * sVar23;
    sVar23 = auVar145._6_2_;
    uVar29 = (ushort)(sVar88 < sVar23) * sVar88 | (ushort)(sVar88 >= sVar23) * sVar23;
    sVar23 = auVar145._8_2_;
    uVar31 = (ushort)(sVar90 < sVar23) * sVar90 | (ushort)(sVar90 >= sVar23) * sVar23;
    sVar23 = auVar145._10_2_;
    uVar33 = (ushort)(sVar92 < sVar23) * sVar92 | (ushort)(sVar92 >= sVar23) * sVar23;
    sVar23 = auVar145._12_2_;
    sVar38 = auVar145._14_2_;
    uVar35 = (ushort)(sVar94 < sVar23) * sVar94 | (ushort)(sVar94 >= sVar23) * sVar23;
    uVar37 = (ushort)(sVar96 < sVar38) * sVar96 | (ushort)(sVar96 >= sVar38) * sVar38;
    sVar23 = auVar43._0_2_;
    uVar40 = (ushort)(sVar84 < sVar23) * sVar84 | (ushort)(sVar84 >= sVar23) * sVar23;
    sVar23 = auVar43._2_2_;
    uVar44 = (ushort)(sVar86 < sVar23) * sVar86 | (ushort)(sVar86 >= sVar23) * sVar23;
    sVar23 = auVar43._4_2_;
    uVar46 = (ushort)(sVar87 < sVar23) * sVar87 | (ushort)(sVar87 >= sVar23) * sVar23;
    sVar23 = auVar43._6_2_;
    uVar48 = (ushort)(sVar88 < sVar23) * sVar88 | (ushort)(sVar88 >= sVar23) * sVar23;
    sVar23 = auVar43._8_2_;
    uVar50 = (ushort)(sVar90 < sVar23) * sVar90 | (ushort)(sVar90 >= sVar23) * sVar23;
    sVar23 = auVar43._10_2_;
    uVar52 = (ushort)(sVar92 < sVar23) * sVar92 | (ushort)(sVar92 >= sVar23) * sVar23;
    sVar23 = auVar43._12_2_;
    sVar38 = auVar43._14_2_;
    uVar54 = (ushort)(sVar94 < sVar23) * sVar94 | (ushort)(sVar94 >= sVar23) * sVar23;
    uVar56 = (ushort)(sVar96 < sVar38) * sVar96 | (ushort)(sVar96 >= sVar38) * sVar38;
    sVar23 = auVar61._0_2_;
    uVar58 = (ushort)(sVar84 < sVar23) * sVar84 | (ushort)(sVar84 >= sVar23) * sVar23;
    sVar23 = auVar61._2_2_;
    uVar63 = (ushort)(sVar86 < sVar23) * sVar86 | (ushort)(sVar86 >= sVar23) * sVar23;
    sVar23 = auVar61._4_2_;
    uVar65 = (ushort)(sVar87 < sVar23) * sVar87 | (ushort)(sVar87 >= sVar23) * sVar23;
    sVar23 = auVar61._6_2_;
    uVar67 = (ushort)(sVar88 < sVar23) * sVar88 | (ushort)(sVar88 >= sVar23) * sVar23;
    sVar23 = auVar61._8_2_;
    uVar69 = (ushort)(sVar90 < sVar23) * sVar90 | (ushort)(sVar90 >= sVar23) * sVar23;
    sVar23 = auVar61._10_2_;
    uVar71 = (ushort)(sVar92 < sVar23) * sVar92 | (ushort)(sVar92 >= sVar23) * sVar23;
    sVar23 = auVar61._12_2_;
    sVar38 = auVar61._14_2_;
    uVar73 = (ushort)(sVar94 < sVar23) * sVar94 | (ushort)(sVar94 >= sVar23) * sVar23;
    uVar75 = (ushort)(sVar96 < sVar38) * sVar96 | (ushort)(sVar96 >= sVar38) * sVar38;
    sVar23 = auVar15._0_2_;
    uVar97 = (ushort)(sVar84 < sVar23) * sVar84 | (ushort)(sVar84 >= sVar23) * sVar23;
    sVar23 = auVar15._2_2_;
    uVar101 = (ushort)(sVar86 < sVar23) * sVar86 | (ushort)(sVar86 >= sVar23) * sVar23;
    sVar23 = auVar15._4_2_;
    uVar103 = (ushort)(sVar87 < sVar23) * sVar87 | (ushort)(sVar87 >= sVar23) * sVar23;
    sVar23 = auVar15._6_2_;
    uVar105 = (ushort)(sVar88 < sVar23) * sVar88 | (ushort)(sVar88 >= sVar23) * sVar23;
    sVar23 = auVar15._8_2_;
    uVar107 = (ushort)(sVar90 < sVar23) * sVar90 | (ushort)(sVar90 >= sVar23) * sVar23;
    sVar23 = auVar15._10_2_;
    uVar109 = (ushort)(sVar92 < sVar23) * sVar92 | (ushort)(sVar92 >= sVar23) * sVar23;
    sVar23 = auVar15._12_2_;
    sVar38 = auVar15._14_2_;
    uVar111 = (ushort)(sVar94 < sVar23) * sVar94 | (ushort)(sVar94 >= sVar23) * sVar23;
    uVar113 = (ushort)(sVar96 < sVar38) * sVar96 | (ushort)(sVar96 >= sVar38) * sVar38;
    sVar23 = auVar144._0_2_;
    uVar125 = (ushort)(sVar84 < sVar23) * sVar84 | (ushort)(sVar84 >= sVar23) * sVar23;
    sVar23 = auVar144._2_2_;
    uVar128 = (ushort)(sVar86 < sVar23) * sVar86 | (ushort)(sVar86 >= sVar23) * sVar23;
    sVar23 = auVar144._4_2_;
    uVar130 = (ushort)(sVar87 < sVar23) * sVar87 | (ushort)(sVar87 >= sVar23) * sVar23;
    sVar23 = auVar144._6_2_;
    uVar132 = (ushort)(sVar88 < sVar23) * sVar88 | (ushort)(sVar88 >= sVar23) * sVar23;
    sVar23 = auVar144._8_2_;
    uVar134 = (ushort)(sVar90 < sVar23) * sVar90 | (ushort)(sVar90 >= sVar23) * sVar23;
    sVar23 = auVar144._10_2_;
    uVar136 = (ushort)(sVar92 < sVar23) * sVar92 | (ushort)(sVar92 >= sVar23) * sVar23;
    sVar23 = auVar144._12_2_;
    sVar38 = auVar144._14_2_;
    uVar138 = (ushort)(sVar94 < sVar23) * sVar94 | (ushort)(sVar94 >= sVar23) * sVar23;
    uVar140 = (ushort)(sVar96 < sVar38) * sVar96 | (ushort)(sVar96 >= sVar38) * sVar38;
    iVar166 = (int)in[3][0];
    iVar168 = *(int *)((long)in[3] + 4);
    iVar169 = (int)in[3][1];
    iVar170 = *(int *)((long)in[3] + 0xc);
    sVar23 = auVar147._0_2_;
    uVar142 = (ushort)(sVar84 < sVar23) * sVar84 | (ushort)(sVar84 >= sVar23) * sVar23;
    sVar23 = auVar147._2_2_;
    uVar150 = (ushort)(sVar86 < sVar23) * sVar86 | (ushort)(sVar86 >= sVar23) * sVar23;
    sVar23 = auVar147._4_2_;
    uVar152 = (ushort)(sVar87 < sVar23) * sVar87 | (ushort)(sVar87 >= sVar23) * sVar23;
    sVar23 = auVar147._6_2_;
    uVar154 = (ushort)(sVar88 < sVar23) * sVar88 | (ushort)(sVar88 >= sVar23) * sVar23;
    sVar23 = auVar147._8_2_;
    uVar156 = (ushort)(sVar90 < sVar23) * sVar90 | (ushort)(sVar90 >= sVar23) * sVar23;
    sVar23 = auVar147._10_2_;
    uVar158 = (ushort)(sVar92 < sVar23) * sVar92 | (ushort)(sVar92 >= sVar23) * sVar23;
    sVar23 = auVar147._12_2_;
    sVar38 = auVar147._14_2_;
    uVar160 = (ushort)(sVar94 < sVar23) * sVar94 | (ushort)(sVar94 >= sVar23) * sVar23;
    uVar162 = (ushort)(sVar96 < sVar38) * sVar96 | (ushort)(sVar96 >= sVar38) * sVar38;
    auVar145 = pmovzxwd(auVar85,auVar21);
    if (bVar14) {
      auVar117._0_4_ = iVar5 + auVar145._0_4_;
      auVar117._4_4_ = iVar6 + auVar145._4_4_;
      auVar117._8_4_ = iVar7 + auVar145._8_4_;
      auVar117._12_4_ = iVar8 + auVar145._12_4_;
    }
    else {
      auVar117._0_4_ = iVar170 + auVar145._0_4_;
      auVar117._4_4_ = iVar169 + auVar145._4_4_;
      auVar117._8_4_ = iVar168 + auVar145._8_4_;
      auVar117._12_4_ = iVar166 + auVar145._12_4_;
      iVar166 = iVar8;
      iVar168 = iVar7;
      iVar169 = iVar6;
      iVar170 = iVar5;
    }
    auVar18._0_4_ = iVar166 + (uint)uVar89;
    auVar18._4_4_ = iVar168 + (uint)uVar91;
    auVar18._8_4_ = iVar169 + (uint)uVar93;
    auVar18._12_4_ = iVar170 + (uint)uVar95;
    auVar145 = packusdw(auVar117,auVar18);
    uVar24 = (-1 < (short)uVar22) * uVar22;
    uVar26 = (-1 < (short)uVar25) * uVar25;
    uVar28 = (-1 < (short)uVar27) * uVar27;
    uVar30 = (-1 < (short)uVar29) * uVar29;
    uVar32 = (-1 < (short)uVar31) * uVar31;
    uVar34 = (-1 < (short)uVar33) * uVar33;
    uVar36 = (-1 < (short)uVar35) * uVar35;
    uVar39 = (-1 < (short)uVar37) * uVar37;
    uVar41 = (-1 < (short)uVar40) * uVar40;
    uVar45 = (-1 < (short)uVar44) * uVar44;
    uVar47 = (-1 < (short)uVar46) * uVar46;
    uVar49 = (-1 < (short)uVar48) * uVar48;
    uVar51 = (-1 < (short)uVar50) * uVar50;
    uVar53 = (-1 < (short)uVar52) * uVar52;
    uVar55 = (-1 < (short)uVar54) * uVar54;
    uVar57 = (-1 < (short)uVar56) * uVar56;
    uVar59 = (-1 < (short)uVar58) * uVar58;
    uVar64 = (-1 < (short)uVar63) * uVar63;
    uVar66 = (-1 < (short)uVar65) * uVar65;
    uVar68 = (-1 < (short)uVar67) * uVar67;
    uVar70 = (-1 < (short)uVar69) * uVar69;
    uVar72 = (-1 < (short)uVar71) * uVar71;
    uVar74 = (-1 < (short)uVar73) * uVar73;
    uVar76 = (-1 < (short)uVar75) * uVar75;
    uVar98 = (-1 < (short)uVar97) * uVar97;
    uVar102 = (-1 < (short)uVar101) * uVar101;
    uVar104 = (-1 < (short)uVar103) * uVar103;
    uVar106 = (-1 < (short)uVar105) * uVar105;
    uVar108 = (-1 < (short)uVar107) * uVar107;
    uVar110 = (-1 < (short)uVar109) * uVar109;
    uVar112 = (-1 < (short)uVar111) * uVar111;
    uVar114 = (-1 < (short)uVar113) * uVar113;
    uVar126 = (-1 < (short)uVar125) * uVar125;
    uVar129 = (-1 < (short)uVar128) * uVar128;
    uVar131 = (-1 < (short)uVar130) * uVar130;
    uVar133 = (-1 < (short)uVar132) * uVar132;
    uVar135 = (-1 < (short)uVar134) * uVar134;
    uVar137 = (-1 < (short)uVar136) * uVar136;
    uVar139 = (-1 < (short)uVar138) * uVar138;
    uVar141 = (-1 < (short)uVar140) * uVar140;
    uVar143 = (-1 < (short)uVar142) * uVar142;
    uVar151 = (-1 < (short)uVar150) * uVar150;
    uVar153 = (-1 < (short)uVar152) * uVar152;
    uVar155 = (-1 < (short)uVar154) * uVar154;
    uVar157 = (-1 < (short)uVar156) * uVar156;
    uVar159 = (-1 < (short)uVar158) * uVar158;
    uVar161 = (-1 < (short)uVar160) * uVar160;
    uVar163 = (-1 < (short)uVar162) * uVar162;
    sVar23 = auVar145._0_2_;
    uVar22 = (ushort)(sVar84 < sVar23) * sVar84 | (ushort)(sVar84 >= sVar23) * sVar23;
    sVar23 = auVar145._2_2_;
    uVar25 = (ushort)(sVar86 < sVar23) * sVar86 | (ushort)(sVar86 >= sVar23) * sVar23;
    sVar23 = auVar145._4_2_;
    uVar27 = (ushort)(sVar87 < sVar23) * sVar87 | (ushort)(sVar87 >= sVar23) * sVar23;
    sVar23 = auVar145._6_2_;
    uVar29 = (ushort)(sVar88 < sVar23) * sVar88 | (ushort)(sVar88 >= sVar23) * sVar23;
    sVar23 = auVar145._8_2_;
    uVar31 = (ushort)(sVar90 < sVar23) * sVar90 | (ushort)(sVar90 >= sVar23) * sVar23;
    sVar23 = auVar145._10_2_;
    uVar33 = (ushort)(sVar92 < sVar23) * sVar92 | (ushort)(sVar92 >= sVar23) * sVar23;
    sVar23 = auVar145._12_2_;
    sVar38 = auVar145._14_2_;
    uVar35 = (ushort)(sVar94 < sVar23) * sVar94 | (ushort)(sVar94 >= sVar23) * sVar23;
    uVar37 = (ushort)(sVar96 < sVar38) * sVar96 | (ushort)(sVar96 >= sVar38) * sVar38;
    uVar115 = (-1 < (short)uVar22) * uVar22;
    uVar118 = (-1 < (short)uVar25) * uVar25;
    uVar119 = (-1 < (short)uVar27) * uVar27;
    uVar120 = (-1 < (short)uVar29) * uVar29;
    uVar121 = (-1 < (short)uVar31) * uVar31;
    uVar122 = (-1 < (short)uVar33) * uVar33;
    uVar123 = (-1 < (short)uVar35) * uVar35;
    uVar124 = (-1 < (short)uVar37) * uVar37;
    lVar12 = 0x10;
    palVar13 = in;
  }
  auVar165._2_2_ = 0;
  auVar165._0_2_ = uVar89;
  auVar165._4_2_ = uVar91;
  auVar165._6_2_ = 0;
  auVar165._8_2_ = uVar93;
  auVar165._10_2_ = 0;
  auVar165._12_2_ = uVar95;
  auVar165._14_2_ = 0;
  auVar145 = pmovzxwd(auVar165,*(undefined1 (*) [16])(output + stride * 7));
  iVar5 = (int)(*palVar13)[0];
  iVar6 = *(int *)((long)*palVar13 + 4);
  iVar7 = (int)(*palVar13)[1];
  iVar8 = *(int *)((long)*palVar13 + 0xc);
  piVar3 = (int *)((long)*in + lVar12);
  iVar166 = *piVar3;
  iVar168 = piVar3[1];
  iVar169 = piVar3[2];
  iVar170 = piVar3[3];
  if (fliplr == 0) {
    auVar80._0_4_ = iVar5 + auVar145._0_4_;
    auVar80._4_4_ = iVar6 + auVar145._4_4_;
    auVar80._8_4_ = iVar7 + auVar145._8_4_;
    auVar80._12_4_ = iVar8 + auVar145._12_4_;
  }
  else {
    auVar80._0_4_ = iVar170 + auVar145._0_4_;
    auVar80._4_4_ = iVar169 + auVar145._4_4_;
    auVar80._8_4_ = iVar168 + auVar145._8_4_;
    auVar80._12_4_ = iVar166 + auVar145._12_4_;
    iVar166 = iVar8;
    iVar168 = iVar7;
    iVar169 = iVar6;
    iVar170 = iVar5;
  }
  auVar164._0_4_ = iVar166 + (uint)(ushort)uVar11;
  auVar164._4_4_ = iVar168 + (uint)(ushort)((ulong)uVar11 >> 0x10);
  auVar164._8_4_ = iVar169 + (uint)(ushort)((ulong)uVar11 >> 0x20);
  auVar164._12_4_ = iVar170 + (uint)(ushort)((ulong)uVar11 >> 0x30);
  auVar145 = packusdw(auVar80,auVar164);
  sVar23 = auVar145._0_2_;
  uVar22 = (ushort)(sVar23 < sVar84) * sVar23 | (ushort)(sVar23 >= sVar84) * sVar84;
  sVar84 = auVar145._2_2_;
  uVar25 = (ushort)(sVar84 < sVar86) * sVar84 | (ushort)(sVar84 >= sVar86) * sVar86;
  sVar84 = auVar145._4_2_;
  uVar27 = (ushort)(sVar84 < sVar87) * sVar84 | (ushort)(sVar84 >= sVar87) * sVar87;
  sVar84 = auVar145._6_2_;
  uVar89 = (ushort)(sVar84 < sVar88) * sVar84 | (ushort)(sVar84 >= sVar88) * sVar88;
  sVar84 = auVar145._8_2_;
  uVar91 = (ushort)(sVar84 < sVar90) * sVar84 | (ushort)(sVar84 >= sVar90) * sVar90;
  sVar84 = auVar145._10_2_;
  uVar93 = (ushort)(sVar84 < sVar92) * sVar84 | (ushort)(sVar84 >= sVar92) * sVar92;
  sVar84 = auVar145._12_2_;
  uVar95 = (ushort)(sVar84 < sVar94) * sVar84 | (ushort)(sVar84 >= sVar94) * sVar94;
  sVar84 = auVar145._14_2_;
  uVar29 = (ushort)(sVar84 < sVar96) * sVar84 | (ushort)(sVar84 >= sVar96) * sVar96;
  *output = uVar24;
  output[1] = uVar26;
  output[2] = uVar28;
  output[3] = uVar30;
  output[4] = uVar32;
  output[5] = uVar34;
  output[6] = uVar36;
  output[7] = uVar39;
  puVar4 = output + stride;
  *puVar4 = uVar41;
  puVar4[1] = uVar45;
  puVar4[2] = uVar47;
  puVar4[3] = uVar49;
  puVar4[4] = uVar51;
  puVar4[5] = uVar53;
  puVar4[6] = uVar55;
  puVar4[7] = uVar57;
  puVar4 = output + stride * 2;
  *puVar4 = uVar59;
  puVar4[1] = uVar64;
  puVar4[2] = uVar66;
  puVar4[3] = uVar68;
  puVar4[4] = uVar70;
  puVar4[5] = uVar72;
  puVar4[6] = uVar74;
  puVar4[7] = uVar76;
  puVar4 = output + stride * 3;
  *puVar4 = uVar98;
  puVar4[1] = uVar102;
  puVar4[2] = uVar104;
  puVar4[3] = uVar106;
  puVar4[4] = uVar108;
  puVar4[5] = uVar110;
  puVar4[6] = uVar112;
  puVar4[7] = uVar114;
  puVar4 = output + stride * 4;
  *puVar4 = uVar126;
  puVar4[1] = uVar129;
  puVar4[2] = uVar131;
  puVar4[3] = uVar133;
  puVar4[4] = uVar135;
  puVar4[5] = uVar137;
  puVar4[6] = uVar139;
  puVar4[7] = uVar141;
  puVar4 = output + stride * 5;
  *puVar4 = uVar143;
  puVar4[1] = uVar151;
  puVar4[2] = uVar153;
  puVar4[3] = uVar155;
  puVar4[4] = uVar157;
  puVar4[5] = uVar159;
  puVar4[6] = uVar161;
  puVar4[7] = uVar163;
  puVar4 = output + stride * 6;
  *puVar4 = uVar115;
  puVar4[1] = uVar118;
  puVar4[2] = uVar119;
  puVar4[3] = uVar120;
  puVar4[4] = uVar121;
  puVar4[5] = uVar122;
  puVar4[6] = uVar123;
  puVar4[7] = uVar124;
  puVar4 = output + stride * 7;
  *puVar4 = (-1 < (short)uVar22) * uVar22;
  puVar4[1] = (-1 < (short)uVar25) * uVar25;
  puVar4[2] = (-1 < (short)uVar27) * uVar27;
  puVar4[3] = (-1 < (short)uVar89) * uVar89;
  puVar4[4] = (-1 < (short)uVar91) * uVar91;
  puVar4[5] = (-1 < (short)uVar93) * uVar93;
  puVar4[6] = (-1 < (short)uVar95) * uVar95;
  puVar4[7] = (-1 < (short)uVar29) * uVar29;
  return;
}

Assistant:

static void write_buffer_8x8(__m128i *in, uint16_t *output, int stride,
                             int fliplr, int flipud, int shift, int bd) {
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;

  round_shift_8x8(in, shift);

  v0 = _mm_load_si128((__m128i const *)(output + 0 * stride));
  v1 = _mm_load_si128((__m128i const *)(output + 1 * stride));
  v2 = _mm_load_si128((__m128i const *)(output + 2 * stride));
  v3 = _mm_load_si128((__m128i const *)(output + 3 * stride));
  v4 = _mm_load_si128((__m128i const *)(output + 4 * stride));
  v5 = _mm_load_si128((__m128i const *)(output + 5 * stride));
  v6 = _mm_load_si128((__m128i const *)(output + 6 * stride));
  v7 = _mm_load_si128((__m128i const *)(output + 7 * stride));

  if (flipud) {
    u0 = get_recon_8x8(v0, in[14], in[15], fliplr, bd);
    u1 = get_recon_8x8(v1, in[12], in[13], fliplr, bd);
    u2 = get_recon_8x8(v2, in[10], in[11], fliplr, bd);
    u3 = get_recon_8x8(v3, in[8], in[9], fliplr, bd);
    u4 = get_recon_8x8(v4, in[6], in[7], fliplr, bd);
    u5 = get_recon_8x8(v5, in[4], in[5], fliplr, bd);
    u6 = get_recon_8x8(v6, in[2], in[3], fliplr, bd);
    u7 = get_recon_8x8(v7, in[0], in[1], fliplr, bd);
  } else {
    u0 = get_recon_8x8(v0, in[0], in[1], fliplr, bd);
    u1 = get_recon_8x8(v1, in[2], in[3], fliplr, bd);
    u2 = get_recon_8x8(v2, in[4], in[5], fliplr, bd);
    u3 = get_recon_8x8(v3, in[6], in[7], fliplr, bd);
    u4 = get_recon_8x8(v4, in[8], in[9], fliplr, bd);
    u5 = get_recon_8x8(v5, in[10], in[11], fliplr, bd);
    u6 = get_recon_8x8(v6, in[12], in[13], fliplr, bd);
    u7 = get_recon_8x8(v7, in[14], in[15], fliplr, bd);
  }

  _mm_store_si128((__m128i *)(output + 0 * stride), u0);
  _mm_store_si128((__m128i *)(output + 1 * stride), u1);
  _mm_store_si128((__m128i *)(output + 2 * stride), u2);
  _mm_store_si128((__m128i *)(output + 3 * stride), u3);
  _mm_store_si128((__m128i *)(output + 4 * stride), u4);
  _mm_store_si128((__m128i *)(output + 5 * stride), u5);
  _mm_store_si128((__m128i *)(output + 6 * stride), u6);
  _mm_store_si128((__m128i *)(output + 7 * stride), u7);
}